

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O3

void write_int32(bson *b,int32_t v)

{
  int iVar1;
  uint8_t *__dest;
  int iVar2;
  
  iVar2 = b->size;
  iVar1 = b->cap;
  if (iVar1 < iVar2 + 4) {
    do {
      iVar1 = iVar1 * 2;
    } while (iVar1 <= iVar2 + 4);
    b->cap = iVar1;
    if (b->ptr == b->buffer) {
      __dest = (uint8_t *)malloc((long)iVar1);
      b->ptr = __dest;
      memcpy(__dest,b->buffer,(long)iVar2);
    }
    else {
      __dest = (uint8_t *)realloc(b->ptr,(long)iVar1);
      b->ptr = __dest;
      iVar2 = b->size;
    }
  }
  else {
    __dest = b->ptr;
  }
  b->size = iVar2 + 1;
  __dest[iVar2] = (uint8_t)v;
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 8);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 0x10);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 0x18);
  return;
}

Assistant:

static inline void
write_int32(struct bson *b, int32_t v) {
	uint32_t uv = (uint32_t)v;
	bson_reserve(b,4);
	b->ptr[b->size++] = uv & 0xff;
	b->ptr[b->size++] = (uv >> 8)&0xff;
	b->ptr[b->size++] = (uv >> 16)&0xff;
	b->ptr[b->size++] = (uv >> 24)&0xff;
}